

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_dense.cpp
# Opt level: O0

void __thiscall
test_matrix_dense_scalar_matrix_multiplication_Test::
~test_matrix_dense_scalar_matrix_multiplication_Test
          (test_matrix_dense_scalar_matrix_multiplication_Test *this)

{
  test_matrix_dense_scalar_matrix_multiplication_Test *this_local;
  
  ~test_matrix_dense_scalar_matrix_multiplication_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_matrix_dense, scalar_matrix_multiplication) {
  Matrix_Dense<Scalar, 0, 0> dynamic_matrix = {{1, 2, 3}, {4, 5, 6}, {7, 8, 9}};
  Matrix_Dense<Scalar, 3, 3> static_matrix = {{10, 20, 30}, {40, 50, 60}, {70, 80, 90}};

  Matrix_Dense<Scalar, 0, 0> result_dynamic = -10.0 * dynamic_matrix;
  EXPECT_DOUBLE_EQ(result_dynamic[0][0], -1.0 * static_matrix[0][0]);
  EXPECT_DOUBLE_EQ(result_dynamic[0][1], -1.0 * static_matrix[0][1]);
  EXPECT_DOUBLE_EQ(result_dynamic[0][2], -1.0 * static_matrix[0][2]);
  EXPECT_DOUBLE_EQ(result_dynamic[1][0], -1.0 * static_matrix[1][0]);
  EXPECT_DOUBLE_EQ(result_dynamic[1][1], -1.0 * static_matrix[1][1]);
  EXPECT_DOUBLE_EQ(result_dynamic[1][2], -1.0 * static_matrix[1][2]);
  EXPECT_DOUBLE_EQ(result_dynamic[2][0], -1.0 * static_matrix[2][0]);
  EXPECT_DOUBLE_EQ(result_dynamic[2][1], -1.0 * static_matrix[2][1]);
  EXPECT_DOUBLE_EQ(result_dynamic[2][2], -1.0 * static_matrix[2][2]);

  Matrix_Dense<Scalar, 3, 3> result_static = 0.1 * static_matrix;
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][0], result_static[0][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][1], result_static[0][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[0][2], result_static[0][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][0], result_static[1][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][1], result_static[1][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[1][2], result_static[1][2]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][0], result_static[2][0]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][1], result_static[2][1]);
  EXPECT_DOUBLE_EQ(dynamic_matrix[2][2], result_static[2][2]);
}